

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicGLSLMisc::Run(BasicGLSLMisc *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int h;
  vec4 *expected;
  allocator_type local_51;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_38;
  
  tcu::Vector<float,_4>::Vector(&local_38,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x1000,&local_38,&local_51);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage3D
            (this_00,0x8c1a,0,0x8814,0x20,0x20,4,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent volatile restrict uniform image2D g_image_layer0;\nlayout(rgba32f) volatile uniform image2D g_image_layer1;\nvec4 Load(layout(rgba32f) volatile image2D image, ivec2 coord) {\n  return imageLoad(image, coord);\n}\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_layer0, coord, vec4(1.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(2.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(0.0, 1.0, 0.0, 1.0));\n  memoryBarrier();\n  o_color = imageLoad(g_image_layer0, coord) + Load(g_image_layer1, coord);\n}"
                     ,(bool *)0x0);
  this->m_program = GVar2;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8814);
  expected = (vec4 *)&DAT_00000001;
  glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,0,'\0',1,35000,0x8814);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  h = 0x20;
  glu::CallLogWrapper::glViewport(this_00,0,0,0x20,0x20);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image_layer0");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image_layer1");
  glu::CallLogWrapper::glUniform1i(this_00,GVar3,1);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 1.0;
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0x20,0x20,(int)&local_38,h,expected);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		const int		  kSize = 32;
		std::vector<vec4> data(kSize * kSize * 4, vec4(0.0f));

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA32F, kSize, kSize, 4, 0, GL_RGBA, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) coherent volatile restrict uniform image2D g_image_layer0;" NL
			"layout(rgba32f) volatile uniform image2D g_image_layer1;" NL
			"vec4 Load(layout(rgba32f) volatile image2D image, ivec2 coord) {" NL "  return imageLoad(image, coord);" NL
			"}" NL "void main() {" NL "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL
			"  imageStore(g_image_layer0, coord, vec4(1.0));" NL "  memoryBarrier();" NL
			"  imageStore(g_image_layer0, coord, vec4(2.0));" NL "  memoryBarrier();" NL
			"  imageStore(g_image_layer0, coord, vec4(0.0, 1.0, 0.0, 1.0));" NL "  memoryBarrier();" NL
			"  o_color = imageLoad(g_image_layer0, coord) + Load(g_image_layer1, coord);" NL "}";
		m_program = BuildProgram(src_vs, NULL, NULL, NULL, src_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 1, GL_READ_ONLY, GL_RGBA32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, kSize, kSize);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_image_layer0"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image_layer1"), 1);

		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}